

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# size.h
# Opt level: O1

Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *
gimage::cropImage<unsigned_short>
          (Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *__return_storage_ptr__,
          Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *image,long x,long y,long w,
          long h)

{
  int iVar1;
  unsigned_short ***pppuVar2;
  unsigned_short ***pppuVar3;
  unsigned_short uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  unsigned_short *puVar10;
  long lVar11;
  long lVar12;
  bool bVar13;
  
  lVar9 = 0;
  if (0 < w) {
    lVar9 = w;
  }
  lVar12 = 0;
  if (0 < h) {
    lVar12 = h;
  }
  iVar1 = image->depth;
  __return_storage_ptr__->depth = 0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->n = 0;
  __return_storage_ptr__->pixel = (unsigned_short *)0x0;
  __return_storage_ptr__->row = (unsigned_short **)0x0;
  __return_storage_ptr__->img = (unsigned_short ***)0x0;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::setSize
            (__return_storage_ptr__,lVar9,lVar12,(long)iVar1);
  if ((((y | x) < 0) || (image->width < lVar9 + x)) || (image->height < lVar12 + y)) {
    uVar5 = (ulong)image->depth;
    bVar13 = 0 < (long)uVar5;
    if (0 < (long)uVar5) {
      uVar6 = 0;
      do {
        if (0 < h) {
          pppuVar2 = __return_storage_ptr__->img;
          lVar9 = 0;
          do {
            if (0 < w) {
              lVar12 = lVar9 + y;
              lVar8 = image->width;
              pppuVar3 = image->img;
              puVar10 = pppuVar2[uVar6][lVar9];
              lVar7 = w;
              lVar11 = x;
              do {
                uVar4 = 0xffff;
                if (((!(bool)(lVar11 < 0 | ~bVar13 & 1U)) && (-1 < lVar12)) &&
                   ((lVar11 < lVar8 && (lVar12 < image->height)))) {
                  uVar4 = pppuVar3[uVar6][lVar12][lVar11];
                }
                *puVar10 = uVar4;
                lVar11 = lVar11 + 1;
                puVar10 = puVar10 + 1;
                lVar7 = lVar7 + -1;
              } while (lVar7 != 0);
            }
            lVar9 = lVar9 + 1;
          } while (lVar9 != h);
        }
        uVar6 = uVar6 + 1;
        bVar13 = uVar6 < uVar5;
      } while (uVar6 != uVar5);
    }
  }
  else if (0 < image->depth) {
    lVar12 = 0;
    do {
      if (0 < h) {
        lVar8 = 0;
        do {
          memcpy(__return_storage_ptr__->img[lVar12][lVar8],image->img[lVar12][y + lVar8] + x,
                 lVar9 * 2);
          lVar8 = lVar8 + 1;
        } while (h != lVar8);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < image->depth);
  }
  return __return_storage_ptr__;
}

Assistant:

Image<T> cropImage(const Image<T> &image, long x, long y, long w, long h)
{
  w=std::max(0l, w);
  h=std::max(0l, h);

  Image<T> ret(w, h, image.getDepth());

  if (x >= 0 && y >= 0 && x+w <= image.getWidth() && y+h <= image.getHeight())
  {
    for (int d=0; d<image.getDepth(); d++)
    {
      for (long k=0; k<h; k++)
      {
        memcpy(ret.getPtr(0, k, d), image.getPtr(x, y+k, d), w*sizeof(T));
      }
    }
  }
  else
  {
    for (int d=0; d<image.getDepth(); d++)
    {
      for (long k=0; k<h; k++)
      {
        for (long i=0; i<w; i++)
          ret.set(i, k, d,
                  static_cast<typename Image<T>::store_t>(image.getBoundsInv(x+i, y+k, d)));
      }
    }
  }

  return ret;
}